

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugins.cpp
# Opt level: O1

void __thiscall f8n::plugin::Plugins::Plugins(Plugins *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  IPreferences IVar1;
  undefined8 uVar2;
  IPreferences local_28;
  undefined8 uStack_20;
  
  (this->prefs).super___shared_ptr<f8n::sdk::IPreferences,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->prefs).super___shared_ptr<f8n::sdk::IPreferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->plugins).
  super__Vector_base<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  (this->plugins).
  super__Vector_base<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->plugins).
  super__Vector_base<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  prefs::Preferences::ForComponent
            ((Preferences *)&stack0xffffffffffffffd8,&PLUGINS_PREFERENCE_abi_cxx11_,ModeAutoSave);
  uVar2 = uStack_20;
  IVar1._vptr_IPreferences = local_28._vptr_IPreferences;
  local_28._vptr_IPreferences = (_func_int **)0x0;
  uStack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->prefs).super___shared_ptr<f8n::sdk::IPreferences,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->prefs).super___shared_ptr<f8n::sdk::IPreferences,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)IVar1._vptr_IPreferences;
  (this->prefs).super___shared_ptr<f8n::sdk::IPreferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_20 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_20);
  }
  LoadPlugins(this);
  return;
}

Assistant:

Plugins::Plugins() {
    this->prefs = Preferences::ForComponent(PLUGINS_PREFERENCE);
    this->LoadPlugins();
}